

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O0

int Saig_ManDetectConstr(Aig_Man_t *p,int iOut,Vec_Ptr_t **pvOuts,Vec_Ptr_t **pvCons)

{
  uint uVar1;
  Aig_Man_t *p_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  Aig_Obj_t *pObj_00;
  int local_68;
  int RetValue;
  int nFlops;
  int i;
  Aig_Obj_t *pFlop;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vUnique;
  Vec_Ptr_t *vSuper2;
  Vec_Ptr_t *vSuper;
  Vec_Ptr_t **pvCons_local;
  Vec_Ptr_t **pvOuts_local;
  Aig_Man_t *pAStack_18;
  int iOut_local;
  Aig_Man_t *p_local;
  
  vUnique = (Vec_Ptr_t *)0x0;
  vSuper = (Vec_Ptr_t *)pvCons;
  pvCons_local = pvOuts;
  pvOuts_local._4_4_ = iOut;
  pAStack_18 = p;
  if ((iOut < 0) || (iVar2 = Saig_ManPoNum(p), iVar2 <= iOut)) {
    __assert_fail("iOut >= 0 && iOut < Saig_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr.c"
                  ,0xa3,"int Saig_ManDetectConstr(Aig_Man_t *, int, Vec_Ptr_t **, Vec_Ptr_t **)");
  }
  *pvCons_local = (Vec_Ptr_t *)0x0;
  vSuper->nCap = 0;
  vSuper->nSize = 0;
  pAVar5 = Aig_ManCo(pAStack_18,pvOuts_local._4_4_);
  pAVar5 = Aig_ObjChild0(pAVar5);
  pAVar6 = Aig_ManConst0(pAStack_18);
  if (pAVar5 == pAVar6) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrStart(1);
    pObj = pAVar5;
    pAVar6 = Aig_ManConst1(pAStack_18);
    Vec_PtrWriteEntry((Vec_Ptr_t *)pAVar5,0,pAVar6);
    *pvCons_local = (Vec_Ptr_t *)pObj;
    pVVar7 = Vec_PtrAlloc(0);
    *(Vec_Ptr_t **)vSuper = pVVar7;
    p_local._4_4_ = -1;
  }
  else {
    iVar2 = Aig_IsComplement(pAVar5);
    if ((iVar2 == 0) && (iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0)) {
      vSuper2 = Saig_DetectConstrCollectSuper(pAVar5);
      iVar2 = Vec_PtrSize(vSuper2);
      if (iVar2 < 2) {
        __assert_fail("Vec_PtrSize(vSuper) >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr.c"
                      ,0xb5,"int Saig_ManDetectConstr(Aig_Man_t *, int, Vec_Ptr_t **, Vec_Ptr_t **)"
                     );
      }
      local_68 = 0;
      for (RetValue = 0; iVar2 = Vec_PtrSize(vSuper2), RetValue < iVar2; RetValue = RetValue + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vSuper2,RetValue);
        p_00 = pAStack_18;
        pAVar5 = Aig_Regular(pAVar5);
        iVar2 = Saig_ObjIsLo(p_00,pAVar5);
        local_68 = iVar2 + local_68;
      }
      if (local_68 == 0) {
        printf("There is no flop outputs.\n");
        Vec_PtrFree(vSuper2);
        p_local._4_4_ = 0;
      }
      else {
        pObj = (Aig_Obj_t *)0x0;
        for (RetValue = 0; iVar2 = Vec_PtrSize(vSuper2), RetValue < iVar2; RetValue = RetValue + 1)
        {
          pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vSuper2,RetValue);
          pAVar6 = Aig_Regular(pAVar5);
          iVar2 = Saig_ObjIsLo(pAStack_18,pAVar6);
          if (iVar2 != 0) {
            pAVar6 = Saig_ObjLoToLi(pAStack_18,pAVar6);
            pAVar6 = Aig_ObjChild0(pAVar6);
            iVar2 = Aig_IsComplement(pAVar6);
            if (iVar2 != 0) {
              pObj_00 = Aig_Regular(pAVar6);
              iVar2 = Aig_ObjIsNode(pObj_00);
              if (iVar2 != 0) {
                pAVar6 = Aig_Regular(pAVar6);
                vUnique = Saig_DetectConstrCollectSuper(pAVar6);
                pObj = (Aig_Obj_t *)Saig_ManDetectConstrCheckCont(vSuper2,vUnique);
                if (pObj != (Aig_Obj_t *)0x0) {
                  iVar2 = Aig_IsComplement(pAVar5);
                  if (iVar2 == 0) {
                    iVar2 = Vec_PtrFind(vUnique,pAVar5);
                    if (iVar2 == -1) {
                      printf("Cannot find special flop about the inputs of OR gate.\n");
                      Vec_PtrFreeP((Vec_Ptr_t **)&pObj);
                      Vec_PtrFree(vUnique);
                    }
                    else {
                      Vec_PtrRemove(vUnique,pAVar5);
                    }
                  }
                  else {
                    printf("Special flop input is complemented.\n");
                    Vec_PtrFreeP((Vec_Ptr_t **)&pObj);
                    Vec_PtrFree(vUnique);
                  }
                  break;
                }
                Vec_PtrFree(vUnique);
              }
            }
          }
        }
        Vec_PtrFree(vSuper2);
        uVar1 = pvOuts_local._4_4_;
        if (pObj == (Aig_Obj_t *)0x0) {
          printf("There is no structural constraints.\n");
          p_local._4_4_ = 0;
        }
        else {
          uVar3 = Vec_PtrSize((Vec_Ptr_t *)pObj);
          uVar4 = Vec_PtrSize(vUnique);
          printf("Output %d : Structural analysis found %d original properties and %d constraints.\n"
                 ,(ulong)uVar1,(ulong)uVar3,(ulong)uVar4);
          p_local._4_4_ = Vec_PtrSize(vUnique);
          *pvCons_local = (Vec_Ptr_t *)pObj;
          *(Vec_Ptr_t **)vSuper = vUnique;
        }
      }
    }
    else {
      printf("The output is not an AND.\n");
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Saig_ManDetectConstr( Aig_Man_t * p, int iOut, Vec_Ptr_t ** pvOuts, Vec_Ptr_t ** pvCons )
{
    Vec_Ptr_t * vSuper, * vSuper2 = NULL, * vUnique;
    Aig_Obj_t * pObj, * pObj2, * pFlop;
    int i, nFlops, RetValue;
    assert( iOut >= 0 && iOut < Saig_ManPoNum(p) );
    *pvOuts = NULL;
    *pvCons = NULL;
    pObj = Aig_ObjChild0( Aig_ManCo(p, iOut) );
    if ( pObj == Aig_ManConst0(p) )
    {
        vUnique = Vec_PtrStart( 1 );
        Vec_PtrWriteEntry( vUnique, 0, Aig_ManConst1(p) );
        *pvOuts = vUnique;
        *pvCons = Vec_PtrAlloc( 0 );
        return -1;
    }
    if ( Aig_IsComplement(pObj) || !Aig_ObjIsNode(pObj) )
    {
        printf( "The output is not an AND.\n" );
        return 0;
    }
    vSuper = Saig_DetectConstrCollectSuper( pObj );
    assert( Vec_PtrSize(vSuper) >= 2 );
    nFlops = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
        nFlops += Saig_ObjIsLo( p, Aig_Regular(pObj) );
    if ( nFlops == 0 )
    {
        printf( "There is no flop outputs.\n" );
        Vec_PtrFree( vSuper );
        return 0;
    }
    // try flops 
    vUnique = NULL;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
    {
        pFlop = Aig_Regular( pObj );
        if ( !Saig_ObjIsLo(p, pFlop) )
            continue;
        pFlop = Saig_ObjLoToLi( p, pFlop );
        pObj2 = Aig_ObjChild0( pFlop );
        if ( !Aig_IsComplement(pObj2) || !Aig_ObjIsNode(Aig_Regular(pObj2)) )
            continue;
        vSuper2 = Saig_DetectConstrCollectSuper( Aig_Regular(pObj2) );
        // every node in vSuper2 should appear in vSuper
        vUnique = Saig_ManDetectConstrCheckCont( vSuper, vSuper2 );
        if ( vUnique != NULL )
        {
///           assert( !Aig_IsComplement(pObj) );
 //           assert( Vec_PtrFind( vSuper2, pObj ) >= 0 );
            if ( Aig_IsComplement(pObj) )
            {
                printf( "Special flop input is complemented.\n" );
                Vec_PtrFreeP( &vUnique );
                Vec_PtrFree( vSuper2 );
                break;
            }
            if ( Vec_PtrFind( vSuper2, pObj ) == -1 )
            {
                printf( "Cannot find special flop about the inputs of OR gate.\n" );
                Vec_PtrFreeP( &vUnique );
                Vec_PtrFree( vSuper2 );
                break;
            }
            // remove the flop output
            Vec_PtrRemove( vSuper2, pObj );
            break;
        }
        Vec_PtrFree( vSuper2 );
    }
    Vec_PtrFree( vSuper );
    if ( vUnique == NULL )
    {
        printf( "There is no structural constraints.\n" );
        return 0;
    }
    // vUnique contains unique entries
    // vSuper2 contains the supergate
    printf( "Output %d : Structural analysis found %d original properties and %d constraints.\n", 
        iOut, Vec_PtrSize(vUnique), Vec_PtrSize(vSuper2) );
    // remember the number of constraints
    RetValue = Vec_PtrSize(vSuper2);
    // make the AND of properties 
//    Vec_PtrFree( vUnique );
//    Vec_PtrFree( vSuper2 );
    *pvOuts = vUnique;
    *pvCons = vSuper2;
    return RetValue;
}